

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O1

void libtest::unit_test<libtest::a_plus_b>::gen
               (usize small_gen_num,usize large_gen_num,bool testcase_cache)

{
  char cVar1;
  int iVar2;
  path *ppVar3;
  ulong in_RCX;
  unit_test<libtest::a_plus_b> *puVar4;
  path *ppVar5;
  path input_file_path;
  path output_file_path;
  path local_110;
  ansi_sgr local_e8;
  unit_test<libtest::a_plus_b> *local_e0;
  unit_test<libtest::a_plus_b> *local_d8;
  path local_d0;
  path local_a8;
  path local_80;
  path local_58;
  
  local_110._M_pathname._M_dataplus._M_p = (pointer)0x24;
  local_e0 = (unit_test<libtest::a_plus_b> *)large_gen_num;
  local_d8 = (unit_test<libtest::a_plus_b> *)small_gen_num;
  printer::cprintf<char_const*>((printer *)&g_printer,(ansi_sgr *)&local_110,"[----------] ");
  local_110._M_pathname._M_dataplus._M_p = (pointer)0x100000025;
  printer::cprintf<char_const*>((printer *)&g_printer,(ansi_sgr *)&local_110,"Generate tests\n");
  if (gen(unsigned_long,unsigned_long,bool)::input_file == '\0') {
    iVar2 = __cxa_guard_acquire(&gen(unsigned_long,unsigned_long,bool)::input_file);
    if (iVar2 != 0) {
      std::ofstream::ofstream(gen(unsigned_long,unsigned_long,bool)::input_file);
      __cxa_atexit(std::ofstream::~ofstream,gen(unsigned_long,unsigned_long,bool)::input_file,
                   &__dso_handle);
      __cxa_guard_release(&gen(unsigned_long,unsigned_long,bool)::input_file);
    }
  }
  if (gen(unsigned_long,unsigned_long,bool)::output_file == '\0') {
    iVar2 = __cxa_guard_acquire(&gen(unsigned_long,unsigned_long,bool)::output_file);
    if (iVar2 != 0) {
      std::ifstream::ifstream(gen(unsigned_long,unsigned_long,bool)::output_file);
      __cxa_atexit(std::ifstream::~ifstream,gen(unsigned_long,unsigned_long,bool)::output_file,
                   &__dso_handle);
      __cxa_guard_release(&gen(unsigned_long,unsigned_long,bool)::output_file);
    }
  }
  test_case_dir_abi_cxx11_();
  std::filesystem::create_directory(&local_110);
  gen_case_dir_abi_cxx11_();
  std::filesystem::create_directory(&local_d0);
  std::filesystem::__cxx11::path::~path(&local_d0);
  std::filesystem::__cxx11::path::~path(&local_110);
  if (local_d8 != (unit_test<libtest::a_plus_b> *)0x0) {
    puVar4 = (unit_test<libtest::a_plus_b> *)0x1;
    do {
      small_genfile_path_abi_cxx11_(&local_110,puVar4,1,SUB81(in_RCX,0));
      small_genfile_path_abi_cxx11_(&local_d0,puVar4,0,SUB81(in_RCX,0));
      if (testcase_cache) {
        cVar1 = std::filesystem::status(&local_110);
        if ((cVar1 == '\0') || (cVar1 == -1)) goto LAB_001077c4;
      }
      else {
LAB_001077c4:
        local_e8.m_color = green;
        local_e8.m_attr = reset;
        printer::cprintf<char_const*>((printer *)&g_printer,&local_e8,"[ GENERATE ] ");
        if (local_110._M_pathname._M_string_length == 0) {
LAB_00107867:
          std::filesystem::__cxx11::path::path(&local_a8);
        }
        else {
          ppVar5 = &local_110;
          if ((~local_110._M_cmpts & 3) != 0) {
            in_RCX = local_110._32_8_;
            if (((local_110._32_8_ & 3) == 0) &&
               (local_110._M_pathname._M_dataplus._M_p[local_110._M_pathname._M_string_length - 1]
                != '/')) {
              if ((local_110._32_8_ & 3) == 0) {
                ppVar3 = (path *)std::filesystem::__cxx11::path::_List::end();
              }
              else {
                ppVar3 = (path *)0x0;
              }
              ppVar5 = (path *)&ppVar3[-2]._M_cmpts;
              if ((local_110._32_8_ & 3) != 0) {
                ppVar5 = ppVar3;
              }
              ppVar3 = ppVar5;
              if ((local_110._32_8_ & 3) != 0) {
                ppVar3 = &local_110;
              }
              in_RCX = local_110._32_8_;
              if ((~*(uint *)&ppVar3->_M_cmpts & 3) == 0) {
                if ((local_110._32_8_ & 3) != 0) {
                  ppVar5 = &local_110;
                }
                goto LAB_0010785d;
              }
            }
            goto LAB_00107867;
          }
LAB_0010785d:
          in_RCX = local_110._32_8_;
          std::filesystem::__cxx11::path::path(&local_a8,ppVar5);
        }
        cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_a8);
        std::filesystem::__cxx11::path::~path(&local_a8);
        std::ofstream::open(gen(unsigned_long,unsigned_long,bool)::input_file,
                            (_Ios_Openmode)local_110._M_pathname._M_dataplus._M_p);
        a_plus_b::generate_input<libtest::a_plus_b::small_constraints>
                  ((ofstream *)gen(unsigned_long,unsigned_long,bool)::input_file);
        std::ofstream::close();
        std::ifstream::open(gen(unsigned_long,unsigned_long,bool)::output_file,
                            (_Ios_Openmode)local_110._M_pathname._M_dataplus._M_p);
        std::ofstream::open(gen(unsigned_long,unsigned_long,bool)::input_file,
                            (_Ios_Openmode)local_d0._M_pathname._M_dataplus._M_p);
        local_e8.m_color = green;
        local_e8.m_attr = reset;
        printer::cprintf<char_const*>((printer *)&g_printer,&local_e8,"[ GENERATE ] ");
        if (local_d0._M_pathname._M_string_length == 0) {
LAB_0010796c:
          std::filesystem::__cxx11::path::path(&local_58);
        }
        else {
          ppVar5 = &local_d0;
          if ((~local_d0._M_cmpts & 3) != 0) {
            in_RCX = local_d0._32_8_;
            if (((local_d0._32_8_ & 3) == 0) &&
               ((local_d0._M_pathname._M_dataplus._M_p + -1)[local_d0._M_pathname._M_string_length]
                != '/')) {
              if ((local_d0._32_8_ & 3) == 0) {
                ppVar3 = (path *)std::filesystem::__cxx11::path::_List::end();
              }
              else {
                ppVar3 = (path *)0x0;
              }
              ppVar5 = (path *)&ppVar3[-2]._M_cmpts;
              if ((local_d0._32_8_ & 3) != 0) {
                ppVar5 = ppVar3;
              }
              ppVar3 = ppVar5;
              if ((local_d0._32_8_ & 3) != 0) {
                ppVar3 = &local_d0;
              }
              in_RCX = local_d0._32_8_;
              if ((~*(uint *)&ppVar3->_M_cmpts & 3) == 0) {
                if ((local_d0._32_8_ & 3) != 0) {
                  ppVar5 = &local_d0;
                }
                goto LAB_00107962;
              }
            }
            goto LAB_0010796c;
          }
LAB_00107962:
          in_RCX = local_d0._32_8_;
          std::filesystem::__cxx11::path::path(&local_58,ppVar5);
        }
        cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_58);
        std::filesystem::__cxx11::path::~path(&local_58);
        a_plus_b::generate_output
                  ((ifstream *)gen(unsigned_long,unsigned_long,bool)::output_file,
                   (ofstream *)gen(unsigned_long,unsigned_long,bool)::input_file);
        std::ofstream::close();
        std::ifstream::close();
      }
      std::filesystem::__cxx11::path::~path(&local_d0);
      std::filesystem::__cxx11::path::~path(&local_110);
      puVar4 = puVar4 + 1;
    } while (puVar4 <= local_d8);
  }
  if (local_e0 != (unit_test<libtest::a_plus_b> *)0x0) {
    puVar4 = (unit_test<libtest::a_plus_b> *)0x1;
    do {
      large_genfile_path_abi_cxx11_(&local_110,puVar4,1,SUB81(in_RCX,0));
      if (testcase_cache) {
        cVar1 = std::filesystem::status(&local_110);
        if ((cVar1 == '\0') || (cVar1 == -1)) goto LAB_00107a2f;
      }
      else {
LAB_00107a2f:
        local_d0._M_pathname._M_dataplus._M_p = (pointer)0x20;
        printer::cprintf<char_const*>((printer *)&g_printer,(ansi_sgr *)&local_d0,"[ GENERATE ] ");
        if (local_110._M_pathname._M_string_length == 0) {
LAB_00107ac4:
          std::filesystem::__cxx11::path::path(&local_80);
        }
        else {
          ppVar5 = &local_110;
          if ((~local_110._M_cmpts & 3) != 0) {
            in_RCX = local_110._32_8_;
            if (((local_110._32_8_ & 3) == 0) &&
               (local_110._M_pathname._M_dataplus._M_p[local_110._M_pathname._M_string_length - 1]
                != '/')) {
              if ((local_110._32_8_ & 3) == 0) {
                ppVar3 = (path *)std::filesystem::__cxx11::path::_List::end();
              }
              else {
                ppVar3 = (path *)0x0;
              }
              ppVar5 = (path *)&ppVar3[-2]._M_cmpts;
              if ((local_110._32_8_ & 3) != 0) {
                ppVar5 = ppVar3;
              }
              ppVar3 = ppVar5;
              if ((local_110._32_8_ & 3) != 0) {
                ppVar3 = &local_110;
              }
              in_RCX = local_110._32_8_;
              if ((~*(uint *)&ppVar3->_M_cmpts & 3) == 0) {
                if ((local_110._32_8_ & 3) != 0) {
                  ppVar5 = &local_110;
                }
                goto LAB_00107aba;
              }
            }
            goto LAB_00107ac4;
          }
LAB_00107aba:
          in_RCX = local_110._32_8_;
          std::filesystem::__cxx11::path::path(&local_80,ppVar5);
        }
        cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_80);
        std::filesystem::__cxx11::path::~path(&local_80);
        std::ofstream::open(gen(unsigned_long,unsigned_long,bool)::input_file,
                            (_Ios_Openmode)local_110._M_pathname._M_dataplus._M_p);
        a_plus_b::generate_input<libtest::a_plus_b::large_constraints>
                  ((ofstream *)gen(unsigned_long,unsigned_long,bool)::input_file);
        std::ofstream::close();
      }
      std::filesystem::__cxx11::path::~path(&local_110);
      puVar4 = puVar4 + 1;
    } while (puVar4 <= local_e0);
  }
  return;
}

Assistant:

static void gen(const usize small_gen_num, const usize large_gen_num, const bool testcase_cache)
    {
        cprintf(base_color, "[----------] "), cprintf(bold_message_color, "Generate tests\n");
        static std::ofstream input_file;
        static std::ifstream output_file;
        fs::create_directory(test_case_dir()), fs::create_directory(gen_case_dir());
        for (usize index = 1; index <= small_gen_num; index++) {
            const fs::path input_file_path = small_genfile_path(index, true), output_file_path = small_genfile_path(index, false);
            if (testcase_cache and fs::exists(input_file_path)) { continue; }
            cprintf(ac_color, "[ GENERATE ] "), cprintln(message_color, input_file_path.filename());
            input_file.open(input_file_path);
            Problem::template generate_input<typename Problem::small_constraints>(input_file);
            input_file.close(), output_file.open(input_file_path), input_file.open(output_file_path);
            cprintf(ac_color, "[ GENERATE ] "), cprintln(message_color, output_file_path.filename());
            Problem::generate_output(output_file, input_file);
            input_file.close(), output_file.close();
        }
        for (usize index = 1; index <= large_gen_num; index++) {
            const fs::path input_file_path = large_genfile_path(index, true);
            if (testcase_cache and fs::exists(input_file_path)) { continue; }
            cprintf(ac_color, "[ GENERATE ] "), cprintln(message_color, input_file_path.filename());
            input_file.open(input_file_path);
            Problem::template generate_input<typename Problem::large_constraints>(input_file);
            input_file.close();
        }
    }